

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

bool __thiscall C3DFile::load(C3DFile *this,char *filename)

{
  ostream *poVar1;
  bool bVar2;
  ifstream c3dstream;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&c3dstream,filename,_S_bin);
  if ((abStack_200[*(long *)(_c3dstream + -0x18)] & 5) == 0) {
    std::istream::read((char *)&c3dstream,(long)this);
    if ((this->header).c3d_id == 'P') {
      readParameterSection(this,&c3dstream);
      fillPointLabelMap(this);
      readPointSection(this,&c3dstream);
      bVar2 = true;
      std::ifstream::close();
      goto LAB_001086cd;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"Invalid C3D file!");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Could not open file ");
    poVar1 = std::operator<<(poVar1,filename);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  bVar2 = false;
LAB_001086cd:
  std::ifstream::~ifstream(&c3dstream);
  return bVar2;
}

Assistant:

bool C3DFile::load (const char* filename) {
	ifstream c3dstream (filename, ios::binary);
	if (!c3dstream) {
		cerr << "Could not open file " << filename << endl;
		return false;
	}

	// header section
	c3dstream.read(reinterpret_cast<char *>(&header), sizeof(C3DHeader));
	if (header.c3d_id != 0x50) {
		cerr << "Invalid C3D file!" << endl;
		return false;
	}

	// parameter Section
	readParameterSection (c3dstream);  

	// we read out all the indices of the labels for easier future reference
	fillPointLabelMap();

	// 3d point data section (we currently ignore the analog part)
	readPointSection(c3dstream);

	c3dstream.close();

	return true;
}